

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts3SegReaderSort(Fts3SegReader **apSegment,int nSegment,int nSuspect,
                      _func_int_Fts3SegReader_ptr_Fts3SegReader_ptr *xCmp)

{
  Fts3SegReader *pFVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  Fts3SegReader *pFVar5;
  Fts3SegReader **ppFVar6;
  uint uVar7;
  uint local_4c;
  
  local_4c = nSuspect - (uint)(nSuspect == nSegment);
  if (0 < (int)local_4c) {
    uVar4 = nSuspect - (uint)(nSuspect == nSegment);
    do {
      uVar4 = uVar4 - 1;
      if ((int)local_4c < nSegment) {
        ppFVar6 = apSegment + (ulong)uVar4 + 1;
        pFVar5 = apSegment[local_4c - 1];
        uVar7 = uVar4;
        do {
          iVar3 = (*xCmp)(pFVar5,*ppFVar6);
          if (iVar3 < 0) break;
          pFVar5 = ppFVar6[-1];
          pFVar1 = *ppFVar6;
          *ppFVar6 = pFVar5;
          ppFVar6[-1] = pFVar1;
          ppFVar6 = ppFVar6 + 1;
          uVar7 = uVar7 + 1;
        } while ((int)uVar7 < nSegment + -1);
      }
      bVar2 = 1 < (int)local_4c;
      local_4c = local_4c - 1;
    } while (bVar2);
  }
  return;
}

Assistant:

static void fts3SegReaderSort(
  Fts3SegReader **apSegment,                     /* Array to sort entries of */
  int nSegment,                                  /* Size of apSegment array */
  int nSuspect,                                  /* Unsorted entry count */
  int (*xCmp)(Fts3SegReader *, Fts3SegReader *)  /* Comparison function */
){
  int i;                          /* Iterator variable */

  assert( nSuspect<=nSegment );

  if( nSuspect==nSegment ) nSuspect--;
  for(i=nSuspect-1; i>=0; i--){
    int j;
    for(j=i; j<(nSegment-1); j++){
      Fts3SegReader *pTmp;
      if( xCmp(apSegment[j], apSegment[j+1])<0 ) break;
      pTmp = apSegment[j+1];
      apSegment[j+1] = apSegment[j];
      apSegment[j] = pTmp;
    }
  }

#ifndef NDEBUG
  /* Check that the list really is sorted now. */
  for(i=0; i<(nSuspect-1); i++){
    assert( xCmp(apSegment[i], apSegment[i+1])<0 );
  }
#endif
}